

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EratBig.cpp
# Opt level: O2

void __thiscall
primesieve::EratBig::storeSievingPrime
          (EratBig *this,uint64_t prime,uint64_t multipleIndex,uint64_t wheelIndex)

{
  uint64_t uVar1;
  byte bVar2;
  SievingPrime **ppSVar3;
  SievingPrime *pSVar4;
  long lVar5;
  SievingPrime **ppSVar6;
  ulong uVar7;
  
  uVar1 = this->moduloSieveSize_;
  bVar2 = (byte)this->log2SieveSize_;
  ppSVar3 = (this->buckets_).end_;
  while( true ) {
    ppSVar6 = (this->buckets_).array_;
    if (((prime / 0x1e) * 10 + ~(-1L << (bVar2 & 0x3f)) + 10 >> (bVar2 & 0x3f)) + 1 <=
        (ulong)((long)ppSVar3 - (long)ppSVar6 >> 3)) break;
    if (ppSVar3 == (this->buckets_).capacity_) {
      lVar5 = (long)ppSVar3 - (long)ppSVar6 >> 2;
      Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::
      reserve_unchecked(&this->buckets_,lVar5 + (ulong)(lVar5 == 0));
      ppSVar3 = (this->buckets_).end_;
    }
    *ppSVar3 = (SievingPrime *)0x0;
    ppSVar3 = (this->buckets_).end_ + 1;
    (this->buckets_).end_ = ppSVar3;
  }
  uVar7 = multipleIndex >> (bVar2 & 0x3f);
  pSVar4 = ppSVar6[uVar7];
  if (((ulong)pSVar4 & 0x1fff) == 0) {
    MemoryPool::addBucket(this->memoryPool_,ppSVar6 + uVar7);
    ppSVar6 = (this->buckets_).array_;
    pSVar4 = ppSVar6[uVar7];
  }
  ppSVar6[uVar7] = pSVar4 + 1;
  pSVar4->indexes_ = (int)wheelIndex << 0x17 | (uint)uVar1 & (uint)multipleIndex;
  pSVar4->sievingPrime_ = (uint32_t)(prime / 0x1e);
  return;
}

Assistant:

void EratBig::storeSievingPrime(uint64_t prime,
                                uint64_t multipleIndex,
                                uint64_t wheelIndex)
{
  uint64_t sieveSize = 1ull << log2SieveSize_;
  uint64_t sievingPrime = prime / 30;
  uint64_t maxNextMultiple = sievingPrime * getMaxFactor() + getMaxFactor();
  uint64_t maxMultipleIndex = sieveSize - 1 + maxNextMultiple;
  uint64_t maxSegmentIndex = maxMultipleIndex >> log2SieveSize_;
  uint64_t newSize = maxSegmentIndex + 1;
  uint64_t segment = multipleIndex >> log2SieveSize_;
  multipleIndex &= moduloSieveSize_;

  while (buckets_.size() < newSize)
    buckets_.push_back(nullptr);

  ASSERT(prime <= maxPrime_);
  ASSERT(segment < buckets_.size());

  if (Bucket::isFull(buckets_[segment]))
    memoryPool_->addBucket(buckets_[segment]);

  buckets_[segment]++->set(sievingPrime, multipleIndex, wheelIndex);
}